

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_setpoint.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_setpoint::ChFunctionRotation_setpoint
          (ChFunctionRotation_setpoint *this,ChFunctionRotation_setpoint *other)

{
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_setpoint_01192c70;
  (this->Q).m_data[0] = 0.0;
  (this->Q).m_data[1] = 0.0;
  (this->Q).m_data[2] = 0.0;
  (this->Q).m_data[3] = 0.0;
  (this->W).m_data[0] = 0.0;
  (this->W).m_data[1] = 0.0;
  (this->W).m_data[2] = 0.0;
  (this->A).m_data[0] = 0.0;
  (this->Q).m_data[2] = 0.0;
  (this->Q).m_data[3] = 0.0;
  (this->W).m_data[0] = 0.0;
  (this->W).m_data[1] = 0.0;
  (this->W).m_data[2] = 0.0;
  (this->A).m_data[0] = 0.0;
  (this->A).m_data[1] = 0.0;
  (this->A).m_data[2] = 0.0;
  *(undefined1 (*) [32])(this->last_Q).m_data = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->last_Q).m_data + 3) = ZEXT432(0) << 0x40;
  this->mode = other->mode;
  this->S = other->S;
  ChQuaternion<double>::operator=(&this->Q,&other->Q);
  if (other != this) {
    (this->W).m_data[0] = (other->W).m_data[0];
    (this->W).m_data[1] = (other->W).m_data[1];
    (this->W).m_data[2] = (other->W).m_data[2];
    (this->A).m_data[0] = (other->A).m_data[0];
    (this->A).m_data[1] = (other->A).m_data[1];
    (this->A).m_data[2] = (other->A).m_data[2];
    this->last_S = other->last_S;
    ChQuaternion<double>::operator=(&this->last_Q,&other->last_Q);
    (this->last_W).m_data[0] = (other->last_W).m_data[0];
    (this->last_W).m_data[1] = (other->last_W).m_data[1];
    (this->last_W).m_data[2] = (other->last_W).m_data[2];
    return;
  }
  this->last_S = other->last_S;
  ChQuaternion<double>::operator=(&this->last_Q,&other->last_Q);
  return;
}

Assistant:

ChFunctionRotation_setpoint::ChFunctionRotation_setpoint(const ChFunctionRotation_setpoint& other) {
    mode = other.mode;
    S = other.S;
    Q = other.Q;
    W = other.W;
    A = other.A;
    last_S = other.last_S;
    last_Q = other.last_Q;
    last_W = other.last_W;
}